

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O3

void __thiscall libtorrent::aux::socks5::read_bindaddr(socks5 *this,error_code *e)

{
  uint uVar1;
  long lVar3;
  uint uVar4;
  transfer_all_t local_79;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  address local_60;
  socket *local_40;
  mutable_buffer local_38;
  uint uVar2;
  
  if (this->m_abort == false) {
    if (e->failed_ == true) {
      if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
        local_60.type_._0_1_ = 0x28;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)&local_60,e);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      uVar1 = 0;
      lVar3 = 0x160;
      do {
        uVar4 = uVar1 << 8;
        uVar2 = (uint)*(byte *)((long)&(this->super_enable_shared_from_this<libtorrent::aux::socks5>
                                       )._M_weak_this.
                                       super___weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + lVar3);
        uVar1 = uVar2 | uVar4;
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 != 0x164);
      local_60._0_8_ =
           (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar2 << 0x18)
           << 0x20;
      local_60.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_60.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_60.ipv6_address_.scope_id_ = 0;
      boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
                (&this->m_udp_proxy_addr,&local_60);
      (this->m_udp_proxy_addr).impl_.data_.v4.sin_port =
           *(in_port_t *)((this->m_tmp_buf)._M_elems + 4);
      this->m_active = true;
      this->m_failures = 0;
      local_38.size_ = 10;
      local_38.data_ = &this->m_tmp_buf;
      ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::socks5,void>
                ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                 (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_60._0_8_ = hung_up;
      local_60.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_60.ipv6_address_.addr_.__in6_u._8_8_ = local_78;
      local_60.ipv6_address_.scope_id_ = (unsigned_long)p_Stack_70;
      local_78 = 0;
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_40 = &this->m_socks5_sock;
      boost::asio::detail::
      initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>
      ::operator()((initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>
                    *)&local_40,
                   (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                    *)&local_60,&local_38,&local_79);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.ipv6_address_.scope_id_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.ipv6_address_.scope_id_)
        ;
      }
      if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
      }
    }
  }
  return;
}

Assistant:

void socks5::read_bindaddr(error_code const& e)
{
	COMPLETE_ASYNC("socks5::read_bindaddr");

	if (m_abort) return;
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::aux;

	char* p = m_tmp_buf.data();
	m_udp_proxy_addr.address(address_v4(read_uint32(p)));
	m_udp_proxy_addr.port(read_uint16(p));

	// we're done!
	m_active = true;
	m_failures = 0;

	ADD_OUTSTANDING_ASYNC("socks5::hung_up");
	boost::asio::async_read(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data(), 10)
		, std::bind(&socks5::hung_up, self(), _1));
}